

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O2

void __thiscall cs::statement_ifelse::run_impl(statement_ifelse *this)

{
  context_t *c;
  bool bVar1;
  _Elt_pointer ppsVar2;
  element_type *peVar3;
  bool *pbVar4;
  _Elt_pointer ppsVar5;
  _Elt_pointer ppsVar6;
  _Map_pointer pppsVar7;
  scope_guard scope;
  runtime_type local_100;
  
  local_100.literals.
  super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>
  .
  super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>
  .slots_ = (slot_type *)(this->mTree).mRoot;
  runtime_type::parse_expr
            (&local_100,
             (iterator *)
             (((this->super_statement_base).context.
               super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->instance).
             super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             (bool)((char)&local_100 + '\b'));
  pbVar4 = cs_impl::any::const_val<bool>((any *)&local_100);
  c = &(this->super_statement_base).context;
  bVar1 = *pbVar4;
  cs_impl::any::recycle((any *)&local_100);
  if (bVar1 == true) {
    scope_guard::scope_guard((scope_guard *)&local_100,c);
    ppsVar5 = (this->mBlock).
              super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl
              .super__Deque_impl_data._M_start._M_cur;
    ppsVar6 = (this->mBlock).
              super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl
              .super__Deque_impl_data._M_start._M_last;
    pppsVar7 = (this->mBlock).
               super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>.
               _M_impl.super__Deque_impl_data._M_start._M_node;
    ppsVar2 = (this->mBlock).
              super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl
              .super__Deque_impl_data._M_finish._M_cur;
    while (ppsVar5 != ppsVar2) {
      statement_base::run(*ppsVar5);
      peVar3 = (((c->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
               instance).super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (((peVar3->return_fcall != false) || (peVar3->break_block != false)) ||
         (peVar3->continue_block != false)) break;
      ppsVar5 = ppsVar5 + 1;
      if (ppsVar5 == ppsVar6) {
        ppsVar5 = pppsVar7[1];
        pppsVar7 = pppsVar7 + 1;
        ppsVar6 = ppsVar5 + 0x40;
      }
    }
  }
  else {
    scope_guard::scope_guard((scope_guard *)&local_100,c);
    ppsVar5 = (this->mElseBlock).
              super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl
              .super__Deque_impl_data._M_start._M_cur;
    ppsVar6 = (this->mElseBlock).
              super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl
              .super__Deque_impl_data._M_start._M_last;
    pppsVar7 = (this->mElseBlock).
               super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>.
               _M_impl.super__Deque_impl_data._M_start._M_node;
    ppsVar2 = (this->mElseBlock).
              super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl
              .super__Deque_impl_data._M_finish._M_cur;
    while (ppsVar5 != ppsVar2) {
      statement_base::run(*ppsVar5);
      peVar3 = (((c->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
               instance).super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (((peVar3->return_fcall != false) || (peVar3->break_block != false)) ||
         (peVar3->continue_block != false)) break;
      ppsVar5 = ppsVar5 + 1;
      if (ppsVar5 == ppsVar6) {
        ppsVar5 = pppsVar7[1];
        pppsVar7 = pppsVar7 + 1;
        ppsVar6 = ppsVar5 + 0x40;
      }
    }
  }
  scope_guard::~scope_guard((scope_guard *)&local_100);
  return;
}

Assistant:

void statement_ifelse::run_impl()
	{
		CS_DEBUGGER_STEP(this);
		if (context->instance->parse_expr(mTree.root()).const_val<boolean>()) {
			scope_guard scope(context);
			for (auto &ptr: mBlock) {
				try {
					ptr->run();
				}
				catch (const cs::exception &e) {
					throw e;
				}
				catch (const std::exception &e) {
					throw exception(ptr->get_line_num(), ptr->get_file_path(), ptr->get_raw_code(), e.what());
				}
				if (context->instance->return_fcall || context->instance->break_block ||
				        context->instance->continue_block)
					break;
			}
		}
		else {
			scope_guard scope(context);
			for (auto &ptr: mElseBlock) {
				try {
					ptr->run();
				}
				catch (const cs::exception &e) {
					throw e;
				}
				catch (const std::exception &e) {
					throw exception(ptr->get_line_num(), ptr->get_file_path(), ptr->get_raw_code(), e.what());
				}
				if (context->instance->return_fcall || context->instance->break_block ||
				        context->instance->continue_block)
					break;
			}
		}
	}